

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall
leveldb::VersionEdit::AddFile
          (VersionEdit *this,int level,uint64_t file,uint64_t file_size,InternalKey *smallest,
          InternalKey *largest)

{
  long lVar1;
  InternalKey *in_RDI;
  long in_FS_OFFSET;
  FileMetaData f;
  pair<int,_leveldb::FileMetaData> *in_stack_fffffffffffffee8;
  InternalKey *in_stack_fffffffffffffef0;
  FileMetaData *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FileMetaData::FileMetaData(in_stack_ffffffffffffff08);
  InternalKey::operator=(in_RDI,in_stack_fffffffffffffef0);
  InternalKey::operator=(in_RDI,in_stack_fffffffffffffef0);
  std::make_pair<int&,leveldb::FileMetaData&>
            ((int *)in_RDI[4].rep_.field_2._M_local_buf,(FileMetaData *)in_stack_fffffffffffffee8);
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::push_back((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               *)in_stack_fffffffffffffee8,(value_type *)0xd1806a);
  std::pair<int,_leveldb::FileMetaData>::~pair(in_stack_fffffffffffffee8);
  FileMetaData::~FileMetaData((FileMetaData *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddFile(int level, uint64_t file, uint64_t file_size,
               const InternalKey& smallest, const InternalKey& largest) {
    FileMetaData f;
    f.number = file;
    f.file_size = file_size;
    f.smallest = smallest;
    f.largest = largest;
    new_files_.push_back(std::make_pair(level, f));
  }